

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O2

string * __thiscall
duckdb_apache::thrift::
to_string<__gnu_cxx::__normal_iterator<duckdb_parquet::PageLocation_const*,std::vector<duckdb_parquet::PageLocation,std::allocator<duckdb_parquet::PageLocation>>>>
          (string *__return_storage_ptr__,thrift *this,
          __normal_iterator<const_duckdb_parquet::PageLocation_*,_std::vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>_>
          *beg,__normal_iterator<const_duckdb_parquet::PageLocation_*,_std::vector<duckdb_parquet::PageLocation,_std::allocator<duckdb_parquet::PageLocation>_>_>
               *end)

{
  PageLocation *t;
  ostringstream o;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  for (t = *(PageLocation **)this; t != beg->_M_current; t = t + 1) {
    if (t != *(PageLocation **)this) {
      std::operator<<((ostream *)local_1a8,", ");
    }
    to_string<duckdb_parquet::PageLocation>(&local_1c8,t);
    std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const T& beg, const T& end) {
  std::ostringstream o;
  for (T it = beg; it != end; ++it) {
    if (it != beg)
      o << ", ";
    o << to_string(*it);
  }
  return o.str();
}